

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateDataDefinitions
          (ParseFunctionGenerator *this,Printer *printer)

{
  bool bVar1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  ParseFunctionGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  bVar1 = should_generate_tctable(this);
  if (bVar1) {
    Formatter::Formatter
              ((Formatter *)local_50,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &this->variables_);
    bVar1 = should_generate_guarded_tctable(this);
    if (bVar1) {
      Formatter::operator()<>
                ((Formatter *)local_50,"#ifdef PROTOBUF_TAIL_CALL_TABLE_PARSER_ENABLED\n");
    }
    GenerateTailCallTable(this,(Formatter *)local_50);
    bVar1 = should_generate_guarded_tctable(this);
    if (bVar1) {
      Formatter::operator()<>
                ((Formatter *)local_50,"#endif  // PROTOBUF_TAIL_CALL_TABLE_PARSER_ENABLED\n");
    }
    Formatter::~Formatter((Formatter *)local_50);
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateDataDefinitions(io::Printer* printer) {
  if (!should_generate_tctable()) {
    return;
  }
  Formatter format(printer, variables_);
  if (should_generate_guarded_tctable()) {
    format("#ifdef PROTOBUF_TAIL_CALL_TABLE_PARSER_ENABLED\n");
  }
  GenerateTailCallTable(format);
  if (should_generate_guarded_tctable()) {
    format("#endif  // PROTOBUF_TAIL_CALL_TABLE_PARSER_ENABLED\n");
  }
}